

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawListFlags *pIVar2;
  ImDrawList *pIVar3;
  float *pfVar4;
  ImGuiNavMoveResult *pIVar5;
  bool *pbVar6;
  ImGuiID *pIVar7;
  ImGuiNextWindowData *pIVar8;
  ImVec2 *pIVar9;
  undefined8 uVar10;
  ImGuiID IVar11;
  ImGuiInputSource IVar12;
  ImGuiID IVar13;
  ImFontAtlas *pIVar14;
  uint *puVar15;
  ImGuiWindow **ppIVar16;
  ImGuiPopupData *pIVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  ImGuiContext *pIVar21;
  bool bVar22;
  int i;
  int iVar23;
  int iVar24;
  long lVar25;
  uint *__dest;
  ImGuiWindow *pIVar26;
  ulong uVar27;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int i_1;
  uint uVar28;
  ImGuiWindow *window_00;
  char *pcVar29;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar30;
  ImGuiContext *g_4;
  byte bVar31;
  ImGuiWindow *old_nav_window;
  ImGuiNavMoveResult *pIVar32;
  ImRect *pIVar33;
  float *pfVar34;
  ImGuiNavLayer IVar35;
  ImFont *font;
  float *pfVar36;
  ImGuiWindow *window;
  ImGuiContext *g_1;
  ImGuiContext *g;
  ulong uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  byte bVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  ImVec2 IVar46;
  float fVar54;
  ImVec2 IVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  ImVec2 IVar52;
  double dVar51;
  undefined1 auVar53 [16];
  float fVar55;
  ImVec2 IVar56;
  ImVec2 IVar57;
  ImVec2 IVar58;
  float fVar61;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ImRect local_40;
  
  pIVar18 = GImGui;
  bVar41 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xe9b,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a95,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a96,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a97,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a98,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar14 = (GImGui->IO).Fonts;
  if ((pIVar14->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a99,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar14->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar43 = (GImGui->Style).Alpha;
  if ((fVar43 < 0.0) || (1.0 < fVar43)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar25 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar25] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1aa1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1aa5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar18->SettingsLoaded == false) {
    if ((pIVar18->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x25c8,"void ImGui::UpdateSettings()");
    }
    pcVar29 = (pIVar18->IO).IniFilename;
    if (pcVar29 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar29);
    }
    pIVar18->SettingsLoaded = true;
  }
  if ((0.0 < pIVar18->SettingsDirtyTimer) &&
     (fVar43 = pIVar18->SettingsDirtyTimer - (pIVar18->IO).DeltaTime,
     pIVar18->SettingsDirtyTimer = fVar43, fVar43 <= 0.0)) {
    pcVar29 = (pIVar18->IO).IniFilename;
    if (pcVar29 == (char *)0x0) {
      (pIVar18->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar29);
    }
    pIVar18->SettingsDirtyTimer = 0.0;
  }
  pIVar18->Time = (double)(pIVar18->IO).DeltaTime + pIVar18->Time;
  pIVar18->WithinFrameScope = true;
  pIVar18->FrameCount = pIVar18->FrameCount + 1;
  pIVar18->TooltipOverrideCount = 0;
  pIVar18->WindowsActiveCount = 0;
  iVar24 = (pIVar18->MenusIdSubmittedThisFrame).Capacity;
  if (iVar24 < 0) {
    uVar28 = iVar24 / 2 + iVar24;
    uVar42 = 0;
    if (0 < (int)uVar28) {
      uVar42 = uVar28;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((ulong)uVar42 * 4,GImAllocatorUserData);
    puVar15 = (pIVar18->MenusIdSubmittedThisFrame).Data;
    if (puVar15 != (uint *)0x0) {
      memcpy(__dest,puVar15,(long)(pIVar18->MenusIdSubmittedThisFrame).Size << 2);
      puVar15 = (pIVar18->MenusIdSubmittedThisFrame).Data;
      if ((puVar15 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar15,GImAllocatorUserData);
    }
    (pIVar18->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar18->MenusIdSubmittedThisFrame).Capacity = uVar42;
  }
  (pIVar18->MenusIdSubmittedThisFrame).Size = 0;
  fVar43 = (pIVar18->IO).DeltaTime;
  iVar24 = pIVar18->FramerateSecPerFrameIdx;
  pIVar18->FramerateSecPerFrameAccum =
       (fVar43 - pIVar18->FramerateSecPerFrame[iVar24]) + pIVar18->FramerateSecPerFrameAccum;
  pIVar18->FramerateSecPerFrame[iVar24] = fVar43;
  iVar23 = iVar24 + (int)((ulong)((long)(iVar24 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar18->FramerateSecPerFrameIdx = iVar24 + 1 + ((iVar23 >> 6) - (iVar23 >> 0x1f)) * -0x78;
  uVar42 = -(uint)(0.0 < pIVar18->FramerateSecPerFrameAccum);
  (pIVar18->IO).Framerate =
       (float)(~uVar42 & 0x7f7fffff |
              (uint)(1.0 / (pIVar18->FramerateSecPerFrameAccum / 120.0)) & uVar42);
  ((pIVar18->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar14 = (GImGui->IO).Fonts;
    if ((pIVar14->Fonts).Size < 1) {
      pcVar29 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001536f9:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x52e,pcVar29);
    }
    font = *(pIVar14->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar18->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xeb8,"void ImGui::NewFrame()");
  }
  fVar43 = (pIVar18->IO).DisplaySize.x;
  fVar44 = (pIVar18->IO).DisplaySize.y;
  (pIVar18->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar18->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar18->DrawListSharedData).ClipRectFullscreen.z = fVar43;
  (pIVar18->DrawListSharedData).ClipRectFullscreen.w = fVar44;
  fVar43 = (pIVar18->Style).CircleSegmentMaxError;
  (pIVar18->DrawListSharedData).CurveTessellationTol = (pIVar18->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar18->DrawListSharedData,fVar43);
  uVar42 = (uint)(pIVar18->Style).AntiAliasedLines;
  (pIVar18->DrawListSharedData).InitialFlags = uVar42;
  if ((pIVar18->Style).AntiAliasedFill == true) {
    (pIVar18->DrawListSharedData).InitialFlags = uVar42 | 2;
  }
  if (((pIVar18->IO).BackendFlags & 8) != 0) {
    pIVar2 = &(pIVar18->DrawListSharedData).InitialFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 4;
  }
  pIVar3 = &pIVar18->BackgroundDrawList;
  ImDrawList::Clear(pIVar3);
  ImDrawList::PushTextureID(pIVar3,((pIVar18->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar3);
  pIVar3 = &pIVar18->ForegroundDrawList;
  ImDrawList::Clear(pIVar3);
  ImDrawList::PushTextureID(pIVar3,((pIVar18->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar3);
  (pIVar18->DrawData).Valid = false;
  (pIVar18->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar18->DrawData).CmdListsCount = 0;
  (pIVar18->DrawData).TotalIdxCount = 0;
  (pIVar18->DrawData).TotalVtxCount = 0;
  (pIVar18->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar18->DrawData).DisplayPos.y = 0;
  (pIVar18->DrawData).DisplaySize.x = 0.0;
  (pIVar18->DrawData).DisplaySize.y = 0.0;
  (pIVar18->DrawData).FramebufferScale.x = 0.0;
  pIVar19 = GImGui;
  (pIVar18->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar18->DragDropActive == true) &&
     (IVar11 = (pIVar18->DragDropPayload).SourceId, IVar11 == pIVar18->ActiveId)) {
    if (GImGui->ActiveId == IVar11) {
      GImGui->ActiveIdIsAlive = IVar11;
    }
    if (pIVar19->ActiveIdPreviousFrame == IVar11) {
      pIVar19->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar18->HoveredIdPreviousFrame == 0) {
    pIVar18->HoveredIdTimer = 0.0;
LAB_00150f42:
    pIVar18->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar18->HoveredId != 0) && (pIVar18->ActiveId == pIVar18->HoveredId))
  goto LAB_00150f42;
  IVar11 = pIVar18->HoveredId;
  if ((IVar11 != 0) &&
     (pIVar18->HoveredIdTimer = (pIVar18->IO).DeltaTime + pIVar18->HoveredIdTimer,
     pIVar18->ActiveId != IVar11)) {
    pIVar18->HoveredIdNotActiveTimer = (pIVar18->IO).DeltaTime + pIVar18->HoveredIdNotActiveTimer;
  }
  pIVar18->HoveredIdPreviousFrame = IVar11;
  pIVar18->HoveredId = 0;
  pIVar18->HoveredIdAllowOverlap = false;
  IVar11 = pIVar18->ActiveId;
  if (((pIVar18->ActiveIdIsAlive != IVar11) && (IVar11 != 0)) &&
     (pIVar18->ActiveIdPreviousFrame == IVar11)) {
    ClearActiveID();
  }
  IVar11 = pIVar18->ActiveId;
  if (IVar11 != 0) {
    pIVar18->ActiveIdTimer = (pIVar18->IO).DeltaTime + pIVar18->ActiveIdTimer;
  }
  pIVar18->LastActiveIdTimer = (pIVar18->IO).DeltaTime + pIVar18->LastActiveIdTimer;
  pIVar18->ActiveIdPreviousFrame = IVar11;
  pIVar18->ActiveIdPreviousFrameWindow = pIVar18->ActiveIdWindow;
  pIVar18->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar18->ActiveIdHasBeenEditedBefore;
  pIVar18->ActiveIdIsAlive = 0;
  pIVar18->ActiveIdHasBeenEditedThisFrame = false;
  pIVar18->ActiveIdPreviousFrameIsAlive = false;
  pIVar18->ActiveIdIsJustActivated = false;
  if (IVar11 != pIVar18->TempInputId && pIVar18->TempInputId != 0) {
    pIVar18->TempInputId = 0;
  }
  if (IVar11 == 0) {
    pIVar18->ActiveIdUsingNavDirMask = 0;
    pIVar18->ActiveIdUsingNavInputMask = 0;
    pIVar18->ActiveIdUsingKeyInputMask = 0;
  }
  pIVar18->DragDropAcceptIdPrev = pIVar18->DragDropAcceptIdCurr;
  pIVar18->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar18->DragDropAcceptIdCurr = 0;
  pIVar18->DragDropWithinSource = false;
  pIVar18->DragDropWithinTarget = false;
  pIVar18->DragDropHoldJustPressedId = 0;
  pIVar19 = GImGui;
  bVar38 = (GImGui->IO).KeyCtrl;
  uVar42 = bVar38 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar42 = (uint)bVar38;
  }
  uVar28 = uVar42 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar28 = uVar42;
  }
  uVar42 = uVar28 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar42 = uVar28;
  }
  (pIVar18->IO).KeyMods = uVar42;
  pfVar4 = (pIVar18->IO).KeysDownDuration;
  memcpy((pIVar18->IO).KeysDownDurationPrev,pfVar4,0x800);
  lVar25 = 0;
  do {
    fVar43 = -1.0;
    if ((pIVar18->IO).KeysDown[lVar25] == true) {
      fVar43 = 0.0;
      if (0.0 <= pfVar4[lVar25]) {
        fVar43 = pfVar4[lVar25] + (pIVar18->IO).DeltaTime;
      }
    }
    pfVar4[lVar25] = fVar43;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x200);
  (pIVar19->IO).WantSetMousePos = false;
  pIVar19->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar19->NavWrapRequestFlags = 0;
  uVar42 = (pIVar19->IO).ConfigFlags;
  if ((uVar42 & 2) == 0) {
    bVar31 = 0;
  }
  else {
    bVar31 = (byte)(pIVar19->IO).BackendFlags & 1;
  }
  if ((bVar31 != 0) &&
     (((0.0 < (pIVar19->IO).NavInputs[0] || (0.0 < (pIVar19->IO).NavInputs[2])) ||
      ((0.0 < (pIVar19->IO).NavInputs[1] || (0.0 < (pIVar19->IO).NavInputs[3])))))) {
    pIVar19->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar42 & 1) != 0) {
    iVar24 = (pIVar19->IO).KeyMap[0xc];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_00153703;
      if ((pIVar19->IO).KeysDown[iVar24] == true) {
        (pIVar19->IO).NavInputs[0] = 1.0;
        pIVar19->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar19->IO).KeyMap[0xd];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_00153703;
      if ((pIVar19->IO).KeysDown[iVar24] == true) {
        (pIVar19->IO).NavInputs[2] = 1.0;
        pIVar19->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar19->IO).KeyMap[0xe];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_00153703;
      if ((pIVar19->IO).KeysDown[iVar24] == true) {
        (pIVar19->IO).NavInputs[1] = 1.0;
        pIVar19->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar19->IO).KeyMap[1];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_00153703;
      if ((pIVar19->IO).KeysDown[iVar24] == true) {
        (pIVar19->IO).NavInputs[0x11] = 1.0;
        pIVar19->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar19->IO).KeyMap[2];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_00153703;
      if ((pIVar19->IO).KeysDown[iVar24] == true) {
        (pIVar19->IO).NavInputs[0x12] = 1.0;
        pIVar19->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar19->IO).KeyMap[3];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_00153703;
      if ((pIVar19->IO).KeysDown[iVar24] == true) {
        (pIVar19->IO).NavInputs[0x13] = 1.0;
        pIVar19->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar19->IO).KeyMap[4];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) {
LAB_00153703:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                      ,0x1144,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar19->IO).KeysDown[iVar24] == true) {
        (pIVar19->IO).NavInputs[0x14] = 1.0;
        pIVar19->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar38 = (pIVar19->IO).KeyCtrl;
    if (bVar38 == true) {
      (pIVar19->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar19->IO).KeyShift == true) {
      (pIVar19->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar38 == false) && ((pIVar19->IO).KeyAlt != false)) {
      (pIVar19->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar4 = (pIVar19->IO).NavInputsDownDuration;
  pfVar34 = pfVar4;
  pfVar36 = (pIVar19->IO).NavInputsDownDurationPrev;
  for (lVar25 = 0x15; lVar25 != 0; lVar25 = lVar25 + -1) {
    *pfVar36 = *pfVar34;
    pfVar34 = pfVar34 + (ulong)bVar41 * -2 + 1;
    pfVar36 = pfVar36 + (ulong)bVar41 * -2 + 1;
  }
  lVar25 = 0;
  do {
    fVar43 = -1.0;
    if (0.0 < (pIVar19->IO).NavInputs[lVar25]) {
      fVar43 = 0.0;
      if (0.0 <= pfVar4[lVar25]) {
        fVar43 = pfVar4[lVar25] + (pIVar19->IO).DeltaTime;
      }
    }
    pfVar4[lVar25] = fVar43;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x15);
  IVar11 = pIVar19->NavInitResultId;
  if ((IVar11 != 0) &&
     (((pIVar19->NavDisableHighlight != true || (pIVar19->NavInitRequestFromMove == true)) &&
      (pIVar19->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar35 = pIVar19->NavLayer;
    if (pIVar19->NavInitRequestFromMove == true) {
      SetNavID(IVar11,IVar35,0);
      IVar46 = (pIVar19->NavInitResultRectRel).Max;
      pIVar9 = &pIVar19->NavWindow->NavRectRel[(int)IVar35].Min;
      *pIVar9 = (pIVar19->NavInitResultRectRel).Min;
      pIVar9[1] = IVar46;
      pIVar19->NavMousePosDirty = true;
      pIVar19->NavDisableHighlight = false;
      pIVar19->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar11,IVar35,0);
    }
    IVar46 = (pIVar19->NavInitResultRectRel).Max;
    pIVar9 = &pIVar19->NavWindow->NavRectRel[pIVar19->NavLayer].Min;
    *pIVar9 = (pIVar19->NavInitResultRectRel).Min;
    pIVar9[1] = IVar46;
  }
  pIVar19->NavInitRequest = false;
  pIVar19->NavInitRequestFromMove = false;
  pIVar19->NavInitResultId = 0;
  pIVar19->NavJustMovedToId = 0;
  pIVar20 = GImGui;
  if (pIVar19->NavMoveRequest == true) {
    IVar11 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar11 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar20->NavDisableHighlight = false;
        pIVar20->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar5 = &GImGui->NavMoveResultOther;
      pIVar32 = &GImGui->NavMoveResultLocal;
      if (IVar11 == 0) {
        pIVar32 = pIVar5;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar11 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar11 != 0)) &&
         (IVar11 != GImGui->NavId)) {
        pIVar32 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar32 != pIVar5) && ((GImGui->NavMoveResultOther).ID != 0)) &&
         (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar43 = (GImGui->NavMoveResultOther).DistBox;
        fVar44 = pIVar32->DistBox;
        if (fVar44 <= fVar43) {
          if (((fVar43 != fVar44) || (NAN(fVar43) || NAN(fVar44))) ||
             (pfVar4 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar32->DistCenter < *pfVar4 || pIVar32->DistCenter == *pfVar4)) goto LAB_0015155c;
        }
        pIVar32 = pIVar5;
      }
LAB_0015155c:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar26 = pIVar32->Window, pIVar26 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                      ,0x222d,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar46 = pIVar32->Window->Pos;
          IVar56 = (pIVar32->RectRel).Min;
          fVar43 = IVar46.x;
          local_40.Min.x = IVar56.x + fVar43;
          fVar44 = IVar46.y;
          local_40.Min.y = IVar56.y + fVar44;
          IVar46 = (pIVar32->RectRel).Max;
          local_40.Max.x = IVar46.x + fVar43;
          local_40.Max.y = IVar46.y + fVar44;
          IVar46 = ScrollToBringRectIntoView(pIVar32->Window,&local_40);
        }
        else {
          fVar43 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar43 = (pIVar26->ScrollMax).y;
          }
          IVar46 = (ImVec2)((ulong)(uint)((pIVar26->Scroll).y - fVar43) << 0x20);
          (pIVar26->ScrollTarget).y = fVar43;
          (pIVar26->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar43 = (pIVar32->RectRel).Min.y;
        fVar44 = (pIVar32->RectRel).Max.x;
        fVar45 = (pIVar32->RectRel).Max.y;
        (pIVar32->RectRel).Min.x = (pIVar32->RectRel).Min.x - IVar46.x;
        (pIVar32->RectRel).Min.y = fVar43 - IVar46.y;
        (pIVar32->RectRel).Max.x = fVar44 - IVar46.x;
        (pIVar32->RectRel).Max.y = fVar45 - IVar46.y;
      }
      ClearActiveID();
      pIVar20->NavWindow = pIVar32->Window;
      IVar11 = pIVar32->ID;
      if (pIVar20->NavId != IVar11) {
        pIVar20->NavJustMovedToId = IVar11;
        pIVar20->NavJustMovedToFocusScopeId = pIVar32->FocusScopeId;
        pIVar20->NavJustMovedToKeyMods = pIVar20->NavMoveRequestKeyMods;
      }
      pIVar21 = GImGui;
      IVar35 = pIVar20->NavLayer;
      SetNavID(IVar11,IVar35,pIVar32->FocusScopeId);
      IVar46 = (pIVar32->RectRel).Max;
      pIVar9 = &pIVar21->NavWindow->NavRectRel[(int)IVar35].Min;
      *pIVar9 = (pIVar32->RectRel).Min;
      pIVar9[1] = IVar46;
      pIVar21->NavMousePosDirty = true;
      pIVar21->NavDisableHighlight = false;
      pIVar21->NavDisableMouseHover = true;
      pIVar20->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar19->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar19->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x2137,"void ImGui::NavUpdate()");
    }
    if (((pIVar19->NavMoveResultLocal).ID == 0) && ((pIVar19->NavMoveResultOther).ID == 0)) {
      pIVar19->NavDisableHighlight = false;
    }
    pIVar19->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar19->NavMousePosDirty == true) && (pIVar19->NavIdIsAlive == true)) {
    if ((((pIVar19->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar19->IO).BackendFlags & 4) != 0 && (pIVar19->NavDisableHighlight == false)) &&
         (pIVar19->NavDisableMouseHover == true)) && (pIVar19->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar46 = NavCalcPreferredRefPos();
      (pIVar19->IO).MousePosPrev = IVar46;
      (pIVar19->IO).MousePos = IVar46;
      (pIVar19->IO).WantSetMousePos = true;
    }
    pIVar19->NavMousePosDirty = false;
  }
  pIVar19->NavIdIsAlive = false;
  pIVar19->NavJustTabbedId = 0;
  IVar35 = pIVar19->NavLayer;
  if (ImGuiNavLayer_Menu < IVar35) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x214d,"void ImGui::NavUpdate()");
  }
  pIVar26 = pIVar19->NavWindow;
  pIVar30 = pIVar26;
  if (pIVar26 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar30->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar30 != pIVar26) {
          pIVar30->NavLastChildNavWindow = pIVar26;
        }
        break;
      }
      ppIVar16 = &pIVar30->ParentWindow;
      pIVar30 = *ppIVar16;
    } while (*ppIVar16 != (ImGuiWindow *)0x0);
    if (((pIVar26 != (ImGuiWindow *)0x0) && (IVar35 == ImGuiNavLayer_Main)) &&
       (pIVar26->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar26->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar20 = GImGui;
  pIVar26 = GetTopMostPopupModal();
  if (pIVar26 == (ImGuiWindow *)0x0) {
    if ((pIVar20->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
       (pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      fVar43 = (pIVar20->IO).DeltaTime * -10.0 + pIVar20->NavWindowingHighlightAlpha;
      fVar43 = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
      pIVar20->NavWindowingHighlightAlpha = fVar43;
      if ((pIVar20->DimBgRatio <= 0.0) && (fVar43 <= 0.0)) {
        pIVar20->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      }
    }
    if (pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar38 = (pIVar20->IO).NavInputsDownDuration[3] == 0.0;
      if ((((pIVar20->IO).KeyCtrl != true) || (iVar24 = (pIVar20->IO).KeyMap[0], iVar24 < 0)) ||
         (bVar40 = IsKeyPressed(iVar24,true), !bVar40)) goto LAB_00151872;
      bVar41 = (byte)(pIVar20->IO).ConfigFlags & 1;
    }
    else {
      bVar38 = false;
LAB_00151872:
      bVar41 = 0;
    }
    if (bVar38 || bVar41 != 0) {
      pIVar26 = pIVar20->NavWindow;
      if (pIVar26 == (ImGuiWindow *)0x0) {
        pIVar26 = FindWindowNavFocusable((pIVar20->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
      }
      if (pIVar26 != (ImGuiWindow *)0x0) {
        pIVar26 = pIVar26->RootWindow;
        pIVar20->NavWindowingTargetAnim = pIVar26;
        pIVar20->NavWindowingTarget = pIVar26;
        pIVar20->NavWindowingTimer = 0.0;
        pIVar20->NavWindowingHighlightAlpha = 0.0;
        pIVar20->NavWindowingToggleLayer = (bool)(bVar41 ^ 1);
        pIVar20->NavInputSource = ImGuiInputSource_NavGamepad - bVar41;
      }
    }
    fVar43 = (pIVar20->IO).DeltaTime + pIVar20->NavWindowingTimer;
    pIVar20->NavWindowingTimer = fVar43;
    if ((pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0) ||
       (pIVar20->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_001519ce:
      bVar38 = false;
      pIVar26 = (ImGuiWindow *)0x0;
    }
    else {
      fVar44 = (fVar43 + -0.2) / 0.05;
      fVar43 = 1.0;
      if (fVar44 <= 1.0) {
        fVar43 = fVar44;
      }
      fVar43 = (float)(~-(uint)(fVar44 < 0.0) & (uint)fVar43);
      uVar28 = -(uint)(fVar43 <= pIVar20->NavWindowingHighlightAlpha);
      pIVar20->NavWindowingHighlightAlpha =
           (float)(uVar28 & (uint)pIVar20->NavWindowingHighlightAlpha | ~uVar28 & (uint)fVar43);
      fVar43 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar44 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar24 = (uint)(0.0 < fVar43) - (uint)(0.0 < fVar44);
      if (iVar24 != 0) {
        NavUpdateWindowingHighlightWindow(iVar24);
        pIVar20->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_001519ce;
      pbVar6 = &pIVar20->NavWindowingToggleLayer;
      *pbVar6 = (bool)(*pbVar6 &
                      (pIVar20->NavWindowingHighlightAlpha <= 1.0 &&
                      pIVar20->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar6 == false) {
        pIVar26 = pIVar20->NavWindowingTarget;
        bVar38 = false;
      }
      else {
        bVar38 = pIVar20->NavWindow != (ImGuiWindow *)0x0;
        pIVar26 = (ImGuiWindow *)0x0;
      }
      pIVar20->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((pIVar20->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (pIVar20->NavInputSource == ImGuiInputSource_NavKeyboard)) {
      fVar44 = (pIVar20->NavWindowingTimer + -0.2) / 0.05;
      fVar43 = 1.0;
      if (fVar44 <= 1.0) {
        fVar43 = fVar44;
      }
      fVar43 = (float)(~-(uint)(fVar44 < 0.0) & (uint)fVar43);
      uVar28 = -(uint)(fVar43 <= pIVar20->NavWindowingHighlightAlpha);
      pIVar20->NavWindowingHighlightAlpha =
           (float)(uVar28 & (uint)pIVar20->NavWindowingHighlightAlpha | ~uVar28 & (uint)fVar43);
      iVar24 = (GImGui->IO).KeyMap[0];
      if ((-1 < iVar24) && (bVar40 = IsKeyPressed(iVar24,true), bVar40)) {
        NavUpdateWindowingHighlightWindow((pIVar20->IO).KeyShift - 1 | 1);
      }
      if ((pIVar20->IO).KeyCtrl == false) {
        pIVar26 = pIVar20->NavWindowingTarget;
      }
    }
    pIVar21 = GImGui;
    fVar43 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar43 == 0.0) && (!NAN(fVar43))) {
      pIVar20->NavWindowingToggleLayer = true;
    }
    bVar40 = bVar38;
    if ((((pIVar20->ActiveId == 0) || (pIVar20->ActiveIdAllowOverlap == true)) && (fVar43 < 0.0)) &&
       ((pIVar20->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar21->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar39 = IsMousePosValid(&(pIVar20->IO).MousePos);
      bVar22 = IsMousePosValid(&(pIVar20->IO).MousePosPrev);
      bVar40 = true;
      if (bVar22 != bVar39) {
        bVar40 = bVar38;
      }
    }
    pIVar30 = pIVar20->NavWindowingTarget;
    if ((pIVar30 != (ImGuiWindow *)0x0) && ((pIVar30->Flags & 4) == 0)) {
      IVar12 = pIVar20->NavInputSource;
      IVar46.x = 0.0;
      IVar46.y = 0.0;
      if ((IVar12 == ImGuiInputSource_NavKeyboard) && ((pIVar20->IO).KeyShift == false)) {
        IVar46 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      }
      if (IVar12 == ImGuiInputSource_NavGamepad) {
        IVar46 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar43 = IVar46.y;
      if (((IVar46.x != 0.0) || (fVar43 != 0.0)) || (NAN(fVar43))) {
        fVar44 = (pIVar20->IO).DisplayFramebufferScale.x;
        fVar45 = (pIVar20->IO).DisplayFramebufferScale.y;
        if (fVar45 <= fVar44) {
          fVar44 = fVar45;
        }
        fVar44 = (float)(int)(fVar44 * (pIVar20->IO).DeltaTime * 800.0);
        IVar56 = pIVar30->RootWindow->Pos;
        local_40.Min.x = IVar56.x + IVar46.x * fVar44;
        local_40.Min.y = IVar56.y + fVar43 * fVar44;
        SetWindowPos(pIVar30->RootWindow,&local_40.Min,1);
        pIVar20->NavDisableMouseHover = true;
        if (((pIVar20->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar26 != (ImGuiWindow *)0x0) {
      if ((pIVar20->NavWindow == (ImGuiWindow *)0x0) || (pIVar26 != pIVar20->NavWindow->RootWindow))
      {
        ClearActiveID();
        pIVar20->NavDisableHighlight = false;
        pIVar20->NavDisableMouseHover = true;
        pIVar30 = pIVar26->NavLastChildNavWindow;
        if (pIVar26->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar30 = pIVar26;
        }
        ClosePopupsOverWindow(pIVar30,false);
        FocusWindow(pIVar30);
        if (pIVar30->NavLastIds[0] == 0) {
          NavInitWindow(pIVar30,false);
        }
        if ((pIVar30->DC).NavLayerActiveMask == 2) {
          pIVar20->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar20->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar40) && (pIVar26 = pIVar20->NavWindow, pIVar30 = pIVar26, pIVar26 != (ImGuiWindow *)0x0)
       ) {
      while (window_00 = pIVar30, window_00->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window_00->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar30 = window_00->ParentWindow, (window_00->Flags & 0x15000000U) != 0x1000000))
        break;
      }
      if (window_00 != pIVar26) {
        FocusWindow(window_00);
        window_00->NavLastChildNavWindow = pIVar26;
      }
      pIVar20->NavDisableHighlight = false;
      pIVar20->NavDisableMouseHover = true;
      IVar35 = ImGuiNavLayer_Main;
      if (((pIVar20->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
        IVar35 = pIVar20->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar35);
    }
  }
  else {
    pIVar20->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((((uVar42 & 1) == 0 & (bVar31 ^ 1)) == 0) && (pIVar19->NavWindow != (ImGuiWindow *)0x0)) {
    bVar38 = (pIVar19->NavWindow->Flags & 0x40000U) == 0;
    (pIVar19->IO).NavActive = bVar38;
    if (((!bVar38) || (pIVar19->NavId == 0)) ||
       (bVar38 = true, pIVar19->NavDisableHighlight != false)) goto LAB_00151d52;
  }
  else {
    (pIVar19->IO).NavActive = false;
LAB_00151d52:
    bVar38 = pIVar19->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar19->IO).NavVisible = bVar38;
  fVar43 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar43 == 0.0) && (!NAN(fVar43))) {
    if (pIVar19->ActiveId == 0) {
      pIVar26 = pIVar19->NavWindow;
      if (((pIVar26 == (ImGuiWindow *)0x0) || ((pIVar26->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar26->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar24 = (pIVar19->OpenPopupStack).Size;
        if ((long)iVar24 < 1) {
          if (pIVar19->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x5000000U) != 0x1000000)) {
              pIVar26->NavLastIds[0] = 0;
            }
            pIVar19->NavId = 0;
            pIVar19->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar19->OpenPopupStack).Data[(long)iVar24 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar24 + -1,true);
        }
      }
      else {
        if (pIVar26->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                        ,0x2169,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar26->ParentWindow);
        pIVar20 = GImGui;
        pIVar30 = GImGui->NavWindow;
        if (pIVar30 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                        ,0x1f44,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
        }
        IVar11 = pIVar26->ChildId;
        GImGui->NavId = IVar11;
        pIVar20->NavFocusScopeId = 0;
        pIVar30->NavLastIds[0] = IVar11;
        pIVar19->NavIdIsAlive = false;
        if (pIVar19->NavDisableMouseHover == true) {
          pIVar19->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar7 = &pIVar19->NavActivateId;
  pIVar19->NavActivateId = 0;
  pIVar19->NavActivateDownId = 0;
  pIVar19->NavActivatePressedId = 0;
  pIVar20 = GImGui;
  pIVar19->NavInputId = 0;
  IVar11 = pIVar19->NavId;
  if ((((IVar11 != 0) && (pIVar19->NavDisableHighlight == false)) &&
      (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar19->NavWindow != (ImGuiWindow *)0x0 && ((pIVar19->NavWindow->Flags & 0x40000) == 0)))) {
    fVar43 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar43) {
      bVar38 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar38 = false;
    }
    IVar13 = pIVar19->ActiveId;
    if (bVar38 && IVar13 == 0) {
      *pIVar7 = IVar11;
    }
    if (IVar13 == 0) {
      if (0.0 < fVar43) goto LAB_001533cb;
    }
    else if (IVar13 == IVar11 && 0.0 < fVar43) {
LAB_001533cb:
      pIVar19->NavActivateDownId = IVar11;
    }
    if (IVar13 == 0) {
      if (bVar38) goto LAB_001533e1;
    }
    else if ((bool)(bVar38 & IVar13 == IVar11)) {
LAB_001533e1:
      pIVar19->NavActivatePressedId = IVar11;
    }
    if (((IVar13 == 0 || IVar13 == IVar11) &&
        (fVar43 = (pIVar20->IO).NavInputsDownDuration[2], fVar43 == 0.0)) && (!NAN(fVar43))) {
      pIVar19->NavInputId = IVar11;
    }
  }
  pIVar26 = pIVar19->NavWindow;
  if ((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x40000) != 0)) {
    pIVar19->NavDisableHighlight = true;
  }
  if ((*pIVar7 != 0) && (pIVar19->NavActivateDownId != *pIVar7)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x2197,"void ImGui::NavUpdate()");
  }
  pIVar19->NavMoveRequest = false;
  IVar11 = pIVar19->NavNextActivateId;
  if (IVar11 != 0) {
    *pIVar7 = IVar11;
    pIVar19->NavActivateDownId = IVar11;
    pIVar19->NavActivatePressedId = IVar11;
    pIVar19->NavInputId = IVar11;
  }
  pIVar19->NavNextActivateId = 0;
  if (pIVar19->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar19->NavMoveDir = -1;
    pIVar19->NavMoveRequestFlags = 0;
    if (((pIVar26 != (ImGuiWindow *)0x0) && (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar26->Flags & 0x40000) == 0)) {
      uVar28 = GImGui->ActiveIdUsingNavDirMask;
      if (((uVar28 & 1) == 0) &&
         ((fVar43 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar43 ||
          (fVar43 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar43)))) {
        pIVar19->NavMoveDir = 0;
      }
      if (((uVar28 & 2) == 0) &&
         ((fVar43 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar43 ||
          (fVar43 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar43)))) {
        pIVar19->NavMoveDir = 1;
      }
      if (((uVar28 & 4) == 0) &&
         ((fVar43 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar43 ||
          (fVar43 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar43)))) {
        pIVar19->NavMoveDir = 2;
      }
      if (((uVar28 & 8) == 0) &&
         ((fVar43 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar43 ||
          (fVar43 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar43)))) {
        pIVar19->NavMoveDir = 3;
      }
    }
    pIVar19->NavMoveClipDir = pIVar19->NavMoveDir;
  }
  else {
    if ((pIVar19->NavMoveDir == -1) || (pIVar19->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x21b2,"void ImGui::NavUpdate()");
    }
    if (pIVar19->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x21b3,"void ImGui::NavUpdate()");
    }
    pIVar19->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar20 = GImGui;
  fVar43 = 0.0;
  if (((((uVar42 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
      (pIVar26 = GImGui->NavWindow, pIVar26 != (ImGuiWindow *)0x0)) &&
     ((((pIVar26->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
    bVar38 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar40 = false;
    bVar39 = false;
    if (bVar38) {
      bVar39 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar38 = IsKeyDown((pIVar20->IO).KeyMap[6]);
    if (bVar38) {
      bVar40 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar38 = IsKeyPressed((pIVar20->IO).KeyMap[7],true);
    if (bVar38) {
      bVar38 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar38 = false;
    }
    bVar22 = IsKeyPressed((pIVar20->IO).KeyMap[8],true);
    if (bVar22) {
      bVar22 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar22 = false;
    }
    fVar43 = 0.0;
    if ((bVar39 != bVar40) || (bVar38 != bVar22)) {
      if (((pIVar26->DC).NavLayerActiveMask == 0) && ((pIVar26->DC).NavHasScroll == true)) {
        bVar40 = IsKeyPressed((pIVar20->IO).KeyMap[5],true);
        if (bVar40) {
          (pIVar26->ScrollTarget).y =
               (pIVar26->Scroll).y - ((pIVar26->InnerRect).Max.y - (pIVar26->InnerRect).Min.y);
LAB_00153692:
          (pIVar26->ScrollTargetCenterRatio).y = 0.0;
        }
        else {
          bVar40 = IsKeyPressed((pIVar20->IO).KeyMap[6],true);
          if (bVar40) {
            fVar43 = ((pIVar26->InnerRect).Max.y - (pIVar26->InnerRect).Min.y) + (pIVar26->Scroll).y
            ;
LAB_0015368b:
            (pIVar26->ScrollTarget).y = fVar43;
            goto LAB_00153692;
          }
          if (bVar38 == false) {
            if (bVar22 != false) {
              fVar43 = (pIVar26->ScrollMax).y;
              goto LAB_0015368b;
            }
          }
          else {
            (pIVar26->ScrollTarget).y = 0.0;
            (pIVar26->ScrollTargetCenterRatio).y = 0.0;
          }
        }
LAB_0015369b:
        fVar43 = 0.0;
      }
      else {
        IVar35 = pIVar20->NavLayer;
        pIVar33 = pIVar26->NavRectRel + IVar35;
        fVar43 = GImGui->FontBaseSize * pIVar26->FontWindowScale;
        if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
          fVar43 = fVar43 * pIVar26->ParentWindow->FontWindowScale;
        }
        fVar43 = (pIVar26->NavRectRel[IVar35].Max.y - pIVar26->NavRectRel[IVar35].Min.y) +
                 (((pIVar26->InnerRect).Max.y - (pIVar26->InnerRect).Min.y) - fVar43);
        fVar43 = (float)(~-(uint)(fVar43 <= 0.0) & (uint)fVar43);
        bVar40 = IsKeyPressed((pIVar20->IO).KeyMap[5],true);
        if (bVar40) {
          fVar43 = -fVar43;
          pIVar20->NavMoveDir = 3;
          pIVar20->NavMoveClipDir = 2;
          pIVar20->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar40 = IsKeyPressed((pIVar20->IO).KeyMap[6],true);
          if (bVar40) {
            pIVar20->NavMoveDir = 2;
            pIVar20->NavMoveClipDir = 3;
            pIVar20->NavMoveRequestFlags = 0x30;
          }
          else {
            if (bVar38 != false) {
              fVar43 = -(pIVar26->Scroll).y;
              pIVar26->NavRectRel[IVar35].Max.y = fVar43;
              pIVar26->NavRectRel[IVar35].Min.y = fVar43;
              fVar43 = (pIVar33->Min).x;
              pIVar9 = &pIVar26->NavRectRel[IVar35].Max;
              if (pIVar9->x <= fVar43 && fVar43 != pIVar9->x) {
                pIVar26->NavRectRel[IVar35].Max.x = 0.0;
                (pIVar33->Min).x = 0.0;
              }
              pIVar20->NavMoveDir = 3;
              pIVar20->NavMoveRequestFlags = 0x50;
              goto LAB_0015369b;
            }
            fVar43 = 0.0;
            if (bVar22 != false) {
              fVar44 = ((pIVar26->ScrollMax).y + (pIVar26->SizeFull).y) - (pIVar26->Scroll).y;
              pIVar26->NavRectRel[IVar35].Max.y = fVar44;
              pIVar26->NavRectRel[IVar35].Min.y = fVar44;
              fVar44 = (pIVar33->Min).x;
              pIVar9 = &pIVar26->NavRectRel[IVar35].Max;
              if (pIVar9->x <= fVar44 && fVar44 != pIVar9->x) {
                pIVar26->NavRectRel[IVar35].Max.x = 0.0;
                (pIVar33->Min).x = 0.0;
              }
              pIVar20->NavMoveDir = 2;
              pIVar20->NavMoveRequestFlags = 0x50;
            }
          }
        }
      }
    }
  }
  uVar42 = pIVar19->NavMoveDir;
  if (uVar42 != 0xffffffff) {
    pIVar19->NavMoveRequest = true;
    pIVar19->NavMoveRequestKeyMods = (pIVar19->IO).KeyMods;
    pIVar19->NavMoveDirLast = uVar42;
  }
  bVar38 = pIVar19->NavMoveRequest;
  if ((bVar38 == true) && (pIVar19->NavId == 0)) {
    pIVar19->NavInitRequest = true;
    pIVar19->NavInitRequestFromMove = true;
    pIVar19->NavInitResultId = 0;
    pIVar19->NavDisableHighlight = false;
  }
  pIVar20 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar6 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar6;
    if (*pbVar6 != false) goto LAB_001521ca;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_001521ca:
    if (pIVar20->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x209f,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar26 = pIVar19->NavWindow;
  if (((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x40000) == 0)) &&
     (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar44 = pIVar20->FontBaseSize * pIVar26->FontWindowScale;
    if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
      fVar44 = fVar44 * pIVar26->ParentWindow->FontWindowScale;
    }
    fVar44 = (float)(int)(fVar44 * 100.0 * (pIVar19->IO).DeltaTime + 0.5);
    if (((pIVar26->DC).NavLayerActiveMask == 0) && (((pIVar26->DC).NavHasScroll & bVar38) == 1)) {
      if (uVar42 < 2) {
        (pIVar26->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0019ad58 + (ulong)(uVar42 == 0) * 4) * fVar44 +
                         (pIVar26->Scroll).x);
        (pIVar26->ScrollTargetCenterRatio).x = 0.0;
      }
      if ((uVar42 & 0xfffffffe) == 2) {
        (pIVar26->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0019ad58 + (ulong)(uVar42 == 2) * 4) * fVar44 +
                         (pIVar26->Scroll).y);
        (pIVar26->ScrollTargetCenterRatio).y = 0.0;
      }
    }
    IVar46 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar45 = IVar46.x;
    fVar54 = IVar46.y;
    if (((fVar45 != 0.0) || (NAN(fVar45))) && (pIVar26->ScrollbarX == true)) {
      (pIVar26->ScrollTarget).x = (float)(int)(fVar45 * fVar44 + (pIVar26->Scroll).x);
      (pIVar26->ScrollTargetCenterRatio).x = 0.0;
      pIVar19->NavMoveFromClampedRefRect = true;
    }
    if ((fVar54 != 0.0) || (NAN(fVar54))) {
      (pIVar26->ScrollTarget).y = (float)(int)(fVar54 * fVar44 + (pIVar26->Scroll).y);
      (pIVar26->ScrollTargetCenterRatio).y = 0.0;
      pIVar19->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar19->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar19->NavMoveResultLocal).ID = 0;
  (pIVar19->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar19->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar19->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar19->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar19->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar19->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar19->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar19->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar19->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar19->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar19->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar19->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar19->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar19->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar19->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar19->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar19->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar19->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar19->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar19->NavMoveResultOther).ID = 0;
  (pIVar19->NavMoveResultOther).FocusScopeId = 0;
  (pIVar19->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar19->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar19->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar19->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar19->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar19->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar19->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar38 != false) && (pIVar19->NavMoveFromClampedRefRect == true)) &&
     (pIVar19->NavLayer == ImGuiNavLayer_Main)) {
    IVar46 = (pIVar26->InnerRect).Min;
    fVar44 = (pIVar26->Pos).x;
    fVar54 = (pIVar26->Pos).y;
    fVar55 = (IVar46.x - fVar44) + -1.0;
    fVar61 = (IVar46.y - fVar54) + -1.0;
    IVar46 = (pIVar26->InnerRect).Max;
    fVar45 = (IVar46.x - fVar44) + 1.0;
    fVar54 = (IVar46.y - fVar54) + 1.0;
    fVar44 = pIVar26->NavRectRel[0].Min.x;
    if (((fVar44 < fVar55) || (pIVar26->NavRectRel[0].Min.y < fVar61)) ||
       ((fVar45 < pIVar26->NavRectRel[0].Max.x || (fVar54 < pIVar26->NavRectRel[0].Max.y)))) {
      fVar64 = pIVar20->FontBaseSize * pIVar26->FontWindowScale;
      if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
        fVar64 = fVar64 * pIVar26->ParentWindow->FontWindowScale;
      }
      auVar65._0_4_ = fVar64 * 0.5;
      auVar66._0_4_ = fVar45 - fVar55;
      auVar66._4_4_ = fVar54 - fVar61;
      auVar66._8_8_ = 0;
      auVar65._4_4_ = auVar65._0_4_;
      auVar65._8_4_ = auVar65._0_4_;
      auVar65._12_4_ = auVar65._0_4_;
      auVar67 = minps(auVar66,auVar65);
      fVar55 = fVar55 + auVar67._0_4_;
      fVar61 = fVar61 + auVar67._4_4_;
      fVar64 = pIVar26->NavRectRel[0].Min.y;
      uVar42 = -(uint)(fVar55 <= fVar44);
      uVar28 = -(uint)(fVar61 <= fVar64);
      auVar59._0_4_ = fVar45 - auVar67._0_4_;
      auVar59._4_4_ = fVar54 - auVar67._4_4_;
      auVar59._8_4_ = 0.0 - auVar67._8_4_;
      auVar59._12_4_ = 0.0 - auVar67._12_4_;
      auVar67._8_8_ = 0;
      auVar67._0_4_ = pIVar26->NavRectRel[0].Max.x;
      auVar67._4_4_ = pIVar26->NavRectRel[0].Max.y;
      auVar59 = minps(auVar67,auVar59);
      pIVar26->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar28 & (uint)fVar61,~uVar42 & (uint)fVar55) |
                   CONCAT44((uint)fVar64 & uVar28,(uint)fVar44 & uVar42));
      pIVar26->NavRectRel[0].Max = auVar59._0_8_;
      pIVar19->NavId = 0;
      pIVar19->NavFocusScopeId = 0;
    }
    pIVar19->NavMoveFromClampedRefRect = false;
  }
  pIVar26 = pIVar19->NavWindow;
  if (pIVar26 == (ImGuiWindow *)0x0) {
LAB_0015253b:
    IVar47.x = 0.0;
    IVar47.y = 0.0;
    IVar56.x = 0.0;
    IVar56.y = 0.0;
  }
  else {
    IVar56 = pIVar26->NavRectRel[pIVar19->NavLayer].Min;
    IVar47 = pIVar26->NavRectRel[pIVar19->NavLayer].Max;
    if ((IVar47.x < IVar56.x) || (IVar47.y < IVar56.y)) goto LAB_0015253b;
  }
  if (pIVar26 == (ImGuiWindow *)0x0) {
    IVar48 = (GImGui->IO).DisplaySize;
    IVar57.x = 0.0;
    IVar57.y = 0.0;
  }
  else {
    fVar44 = (pIVar26->Pos).x;
    IVar57.x = IVar56.x + fVar44;
    fVar45 = (pIVar26->Pos).y;
    IVar57.y = IVar56.y + fVar45;
    IVar48.x = IVar47.x + fVar44;
    IVar48.y = IVar47.y + fVar45;
  }
  (pIVar19->NavScoringRect).Min = IVar57;
  (pIVar19->NavScoringRect).Max = IVar48;
  fVar54 = (pIVar19->NavScoringRect).Min.y + fVar43;
  (pIVar19->NavScoringRect).Min.y = fVar54;
  fVar43 = fVar43 + (pIVar19->NavScoringRect).Max.y;
  (pIVar19->NavScoringRect).Max.y = fVar43;
  fVar45 = (pIVar19->NavScoringRect).Min.x + 1.0;
  fVar44 = (pIVar19->NavScoringRect).Max.x;
  if (fVar44 <= fVar45) {
    fVar45 = fVar44;
  }
  (pIVar19->NavScoringRect).Min.x = fVar45;
  (pIVar19->NavScoringRect).Max.x = fVar45;
  if (fVar43 < fVar54) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x2205,"void ImGui::NavUpdate()");
  }
  pIVar19->NavScoringCount = 0;
  pIVar19 = GImGui;
  pIVar9 = &(GImGui->IO).MousePos;
  bVar38 = IsMousePosValid(pIVar9);
  if (bVar38) {
    IVar46 = (pIVar19->IO).MousePos;
    IVar49.x = (float)(int)IVar46.x;
    IVar49.y = (float)(int)IVar46.y;
    pIVar19->LastValidMousePos = IVar49;
    (pIVar19->IO).MousePos = IVar49;
  }
  bVar38 = IsMousePosValid(pIVar9);
  if ((bVar38) && (bVar38 = IsMousePosValid(&(pIVar19->IO).MousePosPrev), bVar38)) {
    IVar46 = (pIVar19->IO).MousePos;
    IVar56 = (pIVar19->IO).MousePosPrev;
    IVar50.x = IVar46.x - IVar56.x;
    IVar50.y = IVar46.y - IVar56.y;
    (pIVar19->IO).MouseDelta = IVar50;
  }
  else {
    (pIVar19->IO).MouseDelta.x = 0.0;
    (pIVar19->IO).MouseDelta.y = 0.0;
  }
  if ((((pIVar19->IO).MouseDelta.x != 0.0) || (fVar43 = (pIVar19->IO).MouseDelta.y, fVar43 != 0.0))
     || (NAN(fVar43))) {
    pIVar19->NavDisableMouseHover = false;
  }
  (pIVar19->IO).MousePosPrev = (pIVar19->IO).MousePos;
  lVar25 = -5;
  do {
    fVar43 = -1.0;
    bVar38 = (pIVar19->IO).MouseDown[lVar25 + 5];
    if (bVar38 == true) {
      pfVar4 = (pIVar19->IO).MouseDownDurationPrev + lVar25;
      bVar40 = *pfVar4 <= 0.0 && *pfVar4 != 0.0;
    }
    else {
      bVar40 = false;
    }
    (pIVar19->IO).MouseDoubleClicked[lVar25] = bVar40;
    if (bVar38 == false) {
      bVar39 = 0.0 <= (pIVar19->IO).MouseDownDurationPrev[lVar25];
    }
    else {
      bVar39 = false;
    }
    (pIVar19->IO).MouseDownOwned[lVar25] = bVar39;
    fVar44 = (pIVar19->IO).MouseDownDurationPrev[lVar25];
    (&(pIVar19->IO).MouseDragMaxDistanceAbs[0].x)[lVar25] = fVar44;
    if ((bVar38 != false) && (fVar43 = 0.0, 0.0 <= fVar44)) {
      fVar43 = fVar44 + (pIVar19->IO).DeltaTime;
    }
    (pIVar19->IO).MouseDownDurationPrev[lVar25] = fVar43;
    (pIVar19->IO).MouseReleased[lVar25] = false;
    if (bVar40 == false) {
      if (bVar38 != false) {
        bVar38 = IsMousePosValid(pIVar9);
        auVar53 = ZEXT816(0);
        if (bVar38) {
          IVar46 = (pIVar19->IO).MousePos;
          uVar10 = *(undefined8 *)((long)(pIVar19->IO).MouseClickedTime + lVar25 * 8 + -4);
          auVar53._0_4_ = IVar46.x - (float)uVar10;
          auVar53._4_4_ = IVar46.y - (float)((ulong)uVar10 >> 0x20);
          auVar53._8_8_ = 0;
        }
        fVar43 = (pIVar19->IO).KeysDownDuration[lVar25];
        fVar44 = auVar53._0_4_ * auVar53._0_4_ + auVar53._4_4_ * auVar53._4_4_;
        uVar42 = -(uint)(fVar44 <= fVar43);
        (pIVar19->IO).KeysDownDuration[lVar25] =
             (float)(~uVar42 & (uint)fVar44 | (uint)fVar43 & uVar42);
        uVar10 = *(undefined8 *)((pIVar19->IO).MouseDragMaxDistanceSqr + lVar25 * 2);
        auVar62._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
        auVar62._8_4_ = auVar53._8_4_ ^ 0x80000000;
        auVar62._12_4_ = auVar53._12_4_ ^ 0x80000000;
        auVar59 = maxps(auVar62,auVar53);
        fVar43 = (float)uVar10;
        fVar44 = (float)((ulong)uVar10 >> 0x20);
        uVar42 = -(uint)(auVar59._0_4_ <= fVar43);
        uVar28 = -(uint)(auVar59._4_4_ <= fVar44);
        *(ulong *)((pIVar19->IO).MouseDragMaxDistanceSqr + lVar25 * 2) =
             CONCAT44(~uVar28 & (uint)auVar59._4_4_,~uVar42 & (uint)auVar59._0_4_) |
             CONCAT44((uint)fVar44 & uVar28,(uint)fVar43 & uVar42);
      }
    }
    else {
      dVar51 = pIVar19->Time;
      if ((float)(dVar51 - *(double *)((pIVar19->IO).MouseClicked + lVar25 * 8)) <
          (pIVar19->IO).MouseDoubleClickTime) {
        bVar38 = IsMousePosValid(pIVar9);
        fVar43 = 0.0;
        fVar44 = 0.0;
        if (bVar38) {
          IVar46 = (pIVar19->IO).MousePos;
          uVar10 = *(undefined8 *)((long)(pIVar19->IO).MouseClickedTime + lVar25 * 8 + -4);
          fVar43 = IVar46.x - (float)uVar10;
          fVar44 = IVar46.y - (float)((ulong)uVar10 >> 0x20);
        }
        fVar45 = (pIVar19->IO).MouseDoubleClickMaxDist;
        dVar51 = -1.79769313486232e+308;
        if (fVar43 * fVar43 + fVar44 * fVar44 < fVar45 * fVar45) {
          (pIVar19->IO).MouseReleased[lVar25] = true;
          dVar51 = -1.79769313486232e+308;
        }
      }
      *(double *)((pIVar19->IO).MouseClicked + lVar25 * 8) = dVar51;
      *(ImVec2 *)((long)(pIVar19->IO).MouseClickedTime + lVar25 * 8 + -4) = (pIVar19->IO).MousePos;
      *(bool *)((long)(pIVar19->IO).MouseDownDuration + lVar25 + -3) =
           (pIVar19->IO).MouseReleased[lVar25];
      pfVar4 = (pIVar19->IO).MouseDragMaxDistanceSqr + lVar25 * 2;
      pfVar4[0] = 0.0;
      pfVar4[1] = 0.0;
      (pIVar19->IO).KeysDownDuration[lVar25] = 0.0;
    }
    if (((pIVar19->IO).MouseDown[lVar25 + 5] == false) &&
       ((pIVar19->IO).MouseDownOwned[lVar25] == false)) {
      *(undefined1 *)((long)(pIVar19->IO).MouseDownDuration + lVar25 + -3) = 0;
    }
    if ((pIVar19->IO).MouseDoubleClicked[lVar25] == true) {
      pIVar19->NavDisableMouseHover = false;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar26 = GetTopMostPopupModal();
  if ((pIVar26 != (ImGuiWindow *)0x0) ||
     ((pIVar18->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar18->NavWindowingHighlightAlpha)))) {
    fVar43 = (pIVar18->IO).DeltaTime * 6.0 + pIVar18->DimBgRatio;
    if (1.0 <= fVar43) {
      fVar43 = 1.0;
    }
    pIVar18->DimBgRatio = fVar43;
  }
  else {
    fVar43 = (pIVar18->IO).DeltaTime * -10.0 + pIVar18->DimBgRatio;
    pIVar18->DimBgRatio = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
  }
  pIVar18->MouseCursor = 0;
  pIVar18->WantTextInputNextFrame = -1;
  pIVar18->WantCaptureMouseNextFrame = -1;
  pIVar18->WantCaptureKeyboardNextFrame = -1;
  (pIVar18->PlatformImePos).x = 1.0;
  pIVar19 = GImGui;
  (pIVar18->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar38 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar38) &&
       (fVar43 = (pIVar19->IO).MouseDragThreshold,
       fVar44 = (pIVar19->IO).MousePos.x - (pIVar19->WheelingWindowRefMousePos).x,
       fVar45 = (pIVar19->IO).MousePos.y - (pIVar19->WheelingWindowRefMousePos).y,
       fVar43 * fVar43 < fVar44 * fVar44 + fVar45 * fVar45)) {
      pIVar19->WheelingWindowTimer = 0.0;
    }
    if (pIVar19->WheelingWindowTimer <= 0.0) {
      pIVar19->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar19->WheelingWindowTimer = 0.0;
    }
  }
  pIVar20 = GImGui;
  fVar43 = (pIVar19->IO).MouseWheel;
  if (((fVar43 != 0.0) || (fVar44 = (pIVar19->IO).MouseWheelH, fVar44 != 0.0)) || (NAN(fVar44))) {
    pIVar26 = pIVar19->WheelingWindow;
    if (pIVar26 == (ImGuiWindow *)0x0) {
      pIVar26 = pIVar19->HoveredWindow;
    }
    if ((pIVar26 != (ImGuiWindow *)0x0) && (pIVar26->Collapsed == false)) {
      fVar44 = 0.0;
      if ((fVar43 != 0.0) || (NAN(fVar43))) {
        if (((pIVar19->IO).KeyCtrl == true) && ((pIVar19->IO).FontAllowUserScaling == true)) {
          if (GImGui->WheelingWindow != pIVar26) {
            GImGui->WheelingWindow = pIVar26;
            pIVar20->WheelingWindowRefMousePos = (pIVar20->IO).MousePos;
            pIVar20->WheelingWindowTimer = 2.0;
          }
          fVar43 = pIVar26->FontWindowScale;
          fVar45 = (pIVar19->IO).MouseWheel * 0.1 + fVar43;
          fVar44 = 2.5;
          if (fVar45 <= 2.5) {
            fVar44 = fVar45;
          }
          fVar44 = (float)(-(uint)(fVar45 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar45 < 0.5) & (uint)fVar44);
          pIVar26->FontWindowScale = fVar44;
          if ((pIVar26->Flags & 0x1000000) == 0) {
            fVar44 = fVar44 / fVar43;
            IVar46 = pIVar26->Size;
            auVar60._8_8_ = 0;
            auVar60._0_4_ = IVar46.x;
            auVar60._4_4_ = IVar46.y;
            IVar56 = (pIVar19->IO).MousePos;
            fVar43 = (pIVar26->Pos).x;
            fVar45 = (pIVar26->Pos).y;
            auVar63._0_4_ = (IVar56.x - fVar43) * (1.0 - fVar44) * IVar46.x;
            auVar63._4_4_ = (IVar56.y - fVar45) * (1.0 - fVar44) * IVar46.y;
            auVar63._8_8_ = 0;
            auVar59 = divps(auVar63,auVar60);
            local_40.Min.x = auVar59._0_4_ + fVar43;
            local_40.Min.y = auVar59._4_4_ + fVar45;
            SetWindowPos(pIVar26,&local_40.Min,0);
            IVar52.x = (float)(int)((pIVar26->Size).x * fVar44);
            IVar52.y = (float)(int)((pIVar26->Size).y * fVar44);
            IVar58.x = (float)(int)((pIVar26->SizeFull).x * fVar44);
            IVar58.y = (float)(int)((pIVar26->SizeFull).y * fVar44);
            pIVar26->Size = IVar52;
            pIVar26->SizeFull = IVar58;
          }
          goto LAB_00152ebc;
        }
        if ((pIVar19->IO).KeyShift == false) {
          fVar44 = fVar43;
        }
      }
      if (((fVar44 != 0.0) || (NAN(fVar44))) && ((pIVar19->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar26) {
          GImGui->WheelingWindow = pIVar26;
          pIVar20->WheelingWindowRefMousePos = (pIVar20->IO).MousePos;
          pIVar20->WheelingWindowTimer = 2.0;
        }
        uVar42 = pIVar26->Flags;
        while (((uVar42 >> 0x18 & 1) != 0 &&
               (((uVar42 & 0x210) == 0x10 ||
                ((fVar43 = (pIVar26->ScrollMax).y, fVar43 == 0.0 && (!NAN(fVar43)))))))) {
          pIVar26 = pIVar26->ParentWindow;
          uVar42 = pIVar26->Flags;
        }
        if ((uVar42 & 0x210) == 0) {
          fVar43 = ((pIVar26->InnerRect).Max.y - (pIVar26->InnerRect).Min.y) * 0.67;
          fVar45 = pIVar20->FontBaseSize * pIVar26->FontWindowScale;
          if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
            fVar45 = fVar45 * pIVar26->ParentWindow->FontWindowScale;
          }
          fVar54 = fVar45 * 5.0;
          if (fVar43 <= fVar45 * 5.0) {
            fVar54 = fVar43;
          }
          (pIVar26->ScrollTarget).y = (pIVar26->Scroll).y - fVar44 * (float)(int)fVar54;
          (pIVar26->ScrollTargetCenterRatio).y = 0.0;
        }
      }
      pIVar20 = GImGui;
      fVar43 = (pIVar19->IO).MouseWheelH;
      if (((fVar43 == 0.0) && (!NAN(fVar43))) || ((pIVar19->IO).KeyShift == true)) {
        fVar44 = (pIVar19->IO).MouseWheel;
        if ((fVar44 != 0.0) || (NAN(fVar44))) {
          fVar43 = 0.0;
          if ((pIVar19->IO).KeyShift == true) {
            fVar43 = fVar44;
          }
        }
        else {
          fVar43 = 0.0;
        }
      }
      if (((fVar43 != 0.0) || (NAN(fVar43))) && ((pIVar19->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar26) {
          GImGui->WheelingWindow = pIVar26;
          pIVar20->WheelingWindowRefMousePos = (pIVar20->IO).MousePos;
          pIVar20->WheelingWindowTimer = 2.0;
        }
        while ((uVar42 = pIVar26->Flags, (uVar42 >> 0x18 & 1) != 0 &&
               (((uVar42 & 0x210) == 0x10 ||
                ((fVar44 = (pIVar26->ScrollMax).x, fVar44 == 0.0 && (!NAN(fVar44)))))))) {
          pIVar26 = pIVar26->ParentWindow;
        }
        if ((uVar42 & 0x210) == 0) {
          fVar44 = ((pIVar26->InnerRect).Max.x - (pIVar26->InnerRect).Min.x) * 0.67;
          fVar45 = pIVar20->FontBaseSize * pIVar26->FontWindowScale;
          if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
            fVar45 = fVar45 * pIVar26->ParentWindow->FontWindowScale;
          }
          fVar54 = fVar45 + fVar45;
          if (fVar44 <= fVar45 + fVar45) {
            fVar54 = fVar44;
          }
          (pIVar26->ScrollTarget).x = (pIVar26->Scroll).x - fVar43 * (float)(int)fVar54;
          (pIVar26->ScrollTargetCenterRatio).x = 0.0;
        }
      }
    }
  }
LAB_00152ebc:
  pIVar19 = GImGui;
  pIVar26 = GImGui->NavWindow;
  if (((pIVar26 == (ImGuiWindow *)0x0) || (pIVar26->Active != true)) ||
     (((pIVar26->Flags & 0x40000) != 0 ||
      (((GImGui->IO).KeyCtrl != false || (iVar24 = (GImGui->IO).KeyMap[0], iVar24 < 0)))))) {
    bVar38 = false;
  }
  else {
    bVar38 = IsKeyPressed(iVar24,true);
  }
  pIVar19->FocusTabPressed = bVar38;
  if ((bVar38 != false) && (pIVar19->ActiveId == 0)) {
    pIVar19->FocusRequestNextWindow = pIVar19->NavWindow;
    pIVar19->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar19->NavId == 0) || (pIVar19->NavIdTabCounter == 0x7fffffff)) {
      iVar24 = -(uint)(pIVar19->IO).KeyShift;
    }
    else {
      iVar24 = pIVar19->NavIdTabCounter + (-(uint)(pIVar19->IO).KeyShift | 1) + 1;
    }
    pIVar19->FocusRequestNextCounterTabStop = iVar24;
  }
  pIVar19->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar19->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar19->FocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar26 = pIVar19->FocusRequestNextWindow;
  if (pIVar26 != (ImGuiWindow *)0x0) {
    pIVar19->FocusRequestCurrWindow = pIVar26;
    if ((pIVar19->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar24 = (pIVar26->DC).FocusCounterRegular, iVar24 != -1)) {
      pIVar19->FocusRequestCurrCounterRegular =
           (pIVar19->FocusRequestNextCounterRegular + iVar24 + 1) % (iVar24 + 1);
    }
    if ((pIVar19->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar24 = (pIVar26->DC).FocusCounterTabStop, iVar24 != -1)) {
      pIVar19->FocusRequestCurrCounterTabStop =
           (pIVar19->FocusRequestNextCounterTabStop + iVar24 + 1) % (iVar24 + 1);
    }
    pIVar19->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar19->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar19->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar19->NavIdTabCounter = 0x7fffffff;
  if ((pIVar18->WindowsFocusOrder).Size != (pIVar18->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xf23,"void ImGui::NewFrame()");
  }
  fVar43 = (pIVar18->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar43) {
    fVar43 = (float)pIVar18->Time - fVar43;
  }
  else {
    fVar43 = 3.4028235e+38;
  }
  uVar42 = (pIVar18->Windows).Size;
  uVar27 = (ulong)uVar42;
  if (uVar42 != 0) {
    uVar37 = 0;
    do {
      if ((long)(int)uVar27 <= (long)uVar37) {
        pcVar29 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001536f9;
      }
      pIVar26 = (pIVar18->Windows).Data[uVar37];
      bVar38 = pIVar26->Active;
      pIVar26->WasActive = bVar38;
      pIVar26->BeginCount = 0;
      pIVar26->Active = false;
      pIVar26->WriteAccessed = false;
      if (((bVar38 == false) && (pIVar26->MemoryCompacted == false)) &&
         (pIVar26->LastTimeActive <= fVar43 && fVar43 != pIVar26->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar26);
      }
      uVar37 = uVar37 + 1;
      uVar27 = (ulong)(uint)(pIVar18->Windows).Size;
    } while (uVar37 != uVar27);
  }
  if ((pIVar18->NavWindow != (ImGuiWindow *)0x0) && (pIVar18->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar24 = (pIVar18->CurrentWindowStack).Capacity;
  if (iVar24 < 0) {
    uVar42 = iVar24 / 2 + iVar24;
    uVar27 = 0;
    if (0 < (int)uVar42) {
      uVar27 = (ulong)uVar42;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar27 * 8,GImAllocatorUserData);
    ppIVar16 = (pIVar18->CurrentWindowStack).Data;
    if (ppIVar16 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar16,(long)(pIVar18->CurrentWindowStack).Size << 3);
      ppIVar16 = (pIVar18->CurrentWindowStack).Data;
      if ((ppIVar16 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar16,GImAllocatorUserData);
    }
    (pIVar18->CurrentWindowStack).Data = __dest_00;
    (pIVar18->CurrentWindowStack).Capacity = (int)uVar27;
  }
  (pIVar18->CurrentWindowStack).Size = 0;
  iVar24 = (pIVar18->BeginPopupStack).Capacity;
  if (iVar24 < 0) {
    uVar42 = iVar24 / 2 + iVar24;
    uVar27 = 0;
    if (0 < (int)uVar42) {
      uVar27 = (ulong)uVar42;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar27 * 0x30,GImAllocatorUserData);
    pIVar17 = (pIVar18->BeginPopupStack).Data;
    if (pIVar17 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar17,(long)(pIVar18->BeginPopupStack).Size * 0x30);
      pIVar17 = (pIVar18->BeginPopupStack).Data;
      if ((pIVar17 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar17,GImAllocatorUserData);
    }
    (pIVar18->BeginPopupStack).Data = __dest_01;
    (pIVar18->BeginPopupStack).Capacity = (int)uVar27;
  }
  (pIVar18->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar18->NavWindow,false);
  pIVar19 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar19->DebugItemPickerActive == true) {
    uVar42 = pIVar19->HoveredIdPreviousFrame;
    pIVar19->MouseCursor = 7;
    iVar24 = (pIVar19->IO).KeyMap[0xe];
    if ((-1 < iVar24) && (bVar38 = IsKeyPressed(iVar24,true), bVar38)) {
      pIVar19->DebugItemPickerActive = false;
    }
    pIVar20 = GImGui;
    if (uVar42 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar19->DebugItemPickerBreakId = uVar42;
      pIVar19->DebugItemPickerActive = false;
    }
    pIVar8 = &pIVar20->NextWindowData;
    *(byte *)&pIVar8->Flags = (byte)pIVar8->Flags | 0x40;
    (pIVar20->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar42);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar42 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar18->WithinFrameScopeWithImplicitWindow = true;
  pIVar19 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar19->NextWindowData).SizeVal.x = 400.0;
  (pIVar19->NextWindowData).SizeVal.y = 400.0;
  (pIVar19->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar18->CurrentWindow->IsFallbackWindow == false) {
    __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xf45,"void ImGui::NewFrame()");
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}